

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::PrintLinkPolicyDiagnosis(cmComputeLinkInformation *this,ostream *os)

{
  char *pcVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  reference pbVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  string local_f8;
  _Base_ptr local_d8;
  undefined1 local_d0;
  reference local_c8;
  string *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  char *sep;
  string line;
  size_type max_size;
  ostream *os_local;
  cmComputeLinkInformation *this_local;
  
  std::operator<<(os,
                  "Policy CMP0003 should be set before this line.  Add code such as\n  if(COMMAND cmake_policy)\n    cmake_policy(SET CMP0003 NEW)\n  endif(COMMAND cmake_policy)\nas early as possible but after the most recent call to cmake_minimum_required or cmake_policy(VERSION).  "
                 );
  poVar3 = std::operator<<(os,"This warning appears because target \"");
  psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  poVar3 = std::operator<<(poVar3,(string *)psVar4);
  std::operator<<(poVar3,"\" links to some libraries for which the linker must search:\n");
  line.field_2._8_8_ = 0x4c;
  std::__cxx11::string::string((string *)&sep);
  pcVar1 = "Resource spec file:\n\n  ";
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->OldUserFlagItems);
  i = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(&this->OldUserFlagItems);
  while( true ) {
    __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(pcVar1 + 0x15);
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&i);
    if (!bVar2) break;
    pbVar5 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      lVar6 = std::__cxx11::string::size();
      lVar7 = std::__cxx11::string::size();
      if ((ulong)line.field_2._8_8_ < lVar6 + lVar7 + 2U) {
        poVar3 = std::operator<<(os,(string *)&sep);
        std::operator<<(poVar3,'\n');
        __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x1226f96;
        std::__cxx11::string::clear();
      }
    }
    std::__cxx11::string::operator+=((string *)&sep,(char *)__range1);
    std::__cxx11::string::operator+=((string *)&sep,(string *)pbVar5);
    pcVar1 = " called with REQUIRED, ";
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    poVar3 = std::operator<<(os,(string *)&sep);
    std::operator<<(poVar3,'\n');
  }
  std::__cxx11::string::~string((string *)&sep);
  std::operator<<(os,"and other libraries with known full path:\n");
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range1_1);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->OldLinkDirItems);
  i_1 = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->OldLinkDirItems);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&i_1);
    if (!bVar2) break;
    local_c8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1_1);
    cmsys::SystemTools::GetFilenamePath(&local_f8,local_c8);
    pVar9 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1_1,&local_f8);
    local_d8 = (_Base_ptr)pVar9.first._M_node;
    local_d0 = pVar9.second;
    std::__cxx11::string::~string((string *)&local_f8);
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      poVar3 = std::operator<<(os,"  ");
      poVar3 = std::operator<<(poVar3,(string *)local_c8);
      std::operator<<(poVar3,'\n');
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::operator<<(os,
                  "CMake is adding directories in the second list to the linker search path in case they are needed to find libraries from the first list (for backwards compatibility with CMake 2.4).  Set policy CMP0003 to OLD or NEW to enable or disable this behavior explicitly.  Run \"cmake --help-policy CMP0003\" for more information."
                 );
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&__range1_1);
  return;
}

Assistant:

void cmComputeLinkInformation::PrintLinkPolicyDiagnosis(std::ostream& os)
{
  // Tell the user what to do.
  /* clang-format off */
  os << "Policy CMP0003 should be set before this line.  "
        "Add code such as\n"
        "  if(COMMAND cmake_policy)\n"
        "    cmake_policy(SET CMP0003 NEW)\n"
        "  endif(COMMAND cmake_policy)\n"
        "as early as possible but after the most recent call to "
        "cmake_minimum_required or cmake_policy(VERSION).  ";
  /* clang-format on */

  // List the items that might need the old-style paths.
  os << "This warning appears because target \"" << this->Target->GetName()
     << "\" links to some libraries for which the linker must search:\n";
  {
    // Format the list of unknown items to be as short as possible while
    // still fitting in the allowed width (a true solution would be the
    // bin packing problem if we were allowed to change the order).
    std::string::size_type max_size = 76;
    std::string line;
    const char* sep = "  ";
    for (std::string const& i : this->OldUserFlagItems) {
      // If the addition of another item will exceed the limit then
      // output the current line and reset it.  Note that the separator
      // is either " " or ", " which is always 2 characters.
      if (!line.empty() && (line.size() + i.size() + 2) > max_size) {
        os << line << '\n';
        sep = "  ";
        line.clear();
      }
      line += sep;
      line += i;
      // Convert to the other separator.
      sep = ", ";
    }
    if (!line.empty()) {
      os << line << '\n';
    }
  }

  // List the paths old behavior is adding.
  os << "and other libraries with known full path:\n";
  std::set<std::string> emitted;
  for (std::string const& i : this->OldLinkDirItems) {
    if (emitted.insert(cmSystemTools::GetFilenamePath(i)).second) {
      os << "  " << i << '\n';
    }
  }

  // Explain.
  os << "CMake is adding directories in the second list to the linker "
        "search path in case they are needed to find libraries from the "
        "first list (for backwards compatibility with CMake 2.4).  "
        "Set policy CMP0003 to OLD or NEW to enable or disable this "
        "behavior explicitly.  "
        "Run \"cmake --help-policy CMP0003\" for more information.";
}